

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_funcuvname(lua_State *L)

{
  TValue *pTVar1;
  uint idx;
  GCproto *pt;
  char *str;
  char *__s;
  size_t lenx;
  GCstr *pGVar2;
  bool bVar3;
  
  pt = check_Lproto(L,0);
  idx = lj_lib_checkint(L,2);
  bVar3 = idx < pt->sizeuv;
  if (bVar3) {
    pTVar1 = L->top;
    str = lj_debug_uvname(pt,idx);
    __s = lj_debug_uvname(pt,idx);
    lenx = strlen(__s);
    pGVar2 = lj_str_new(L,str,lenx);
    pTVar1[-1].u32.lo = (uint32_t)pGVar2;
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffffb;
  }
  return (uint)bVar3;
}

Assistant:

LJLIB_CF(jit_util_funcuvname)
{
  GCproto *pt = check_Lproto(L, 0);
  uint32_t idx = (uint32_t)lj_lib_checkint(L, 2);
  if (idx < pt->sizeuv) {
    setstrV(L, L->top-1, lj_str_newz(L, lj_debug_uvname(pt, idx)));
    return 1;
  }
  return 0;
}